

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O0

EventLoop * __thiscall sznet::net::EventLoopThread::startLoop(EventLoopThread *this)

{
  bool bVar1;
  MutexLock *mutex;
  MutexLockGuard local_20;
  MutexLockGuard lock;
  EventLoop *loop;
  EventLoopThread *this_local;
  
  bVar1 = Thread::started(&this->m_thread);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_thread.started()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoopThread.cpp"
                  ,0x21,"EventLoop *sznet::net::EventLoopThread::startLoop()");
  }
  Thread::start(&this->m_thread);
  lock.m_mutex = (MutexLock *)0x0;
  mutex = &this->m_mutex;
  MutexLockGuard::MutexLockGuard(&local_20,mutex);
  while (this->m_loop == (EventLoop *)0x0) {
    Condition::wait(&this->m_cond,mutex);
  }
  lock.m_mutex = (MutexLock *)this->m_loop;
  MutexLockGuard::~MutexLockGuard(&local_20);
  return (EventLoop *)lock.m_mutex;
}

Assistant:

EventLoop* EventLoopThread::startLoop()
{
	assert(!m_thread.started());
	m_thread.start();

	EventLoop* loop = nullptr;
	// 线程创建好了，还是要等等IO事件循环对象的创建
	{
		MutexLockGuard lock(m_mutex);
		while (m_loop == nullptr)
		{
			m_cond.wait();
		}
		loop = m_loop;
	}

	return loop;
}